

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.h
# Opt level: O2

int InitP33x(P33X *pP33x)

{
  int iVar1;
  char *__s;
  uint8 crc_l;
  uint8 crc_h;
  uint8 writebuf [4];
  uint8 readbuf [10];
  
  crc_h = '\0';
  crc_l = '\0';
  writebuf[0] = 0xfa;
  writebuf[1] = '0';
  CalcCRC16(writebuf,2,writebuf + 2,writebuf + 3);
  iVar1 = WriteAllRS232Port(&pP33x->RS232Port,writebuf,4);
  if (iVar1 == 0) {
    iVar1 = ReadAllRS232Port(&pP33x->RS232Port,readbuf,4);
    __s = "Error reading data from a P33x. ";
    if ((iVar1 == 0) && (iVar1 = ReadAllRS232Port(&pP33x->RS232Port,readbuf,10), iVar1 == 0)) {
      if (readbuf[0] == 0xfa) {
        if (readbuf[1] == '0') {
          CalcCRC16(readbuf,8,&crc_h,&crc_l);
          __s = "Error reading data from a P33x : Bad CRC-16. ";
          if ((readbuf[8] == crc_h) && (readbuf[9] == crc_l)) {
            return 0;
          }
        }
        else {
          __s = "Error reading data from a P33x : The device function failed. ";
        }
      }
      else {
        __s = "Error reading data from a P33x : Bad device address. ";
      }
    }
  }
  else {
    __s = "Error writing data to a P33x. ";
  }
  puts(__s);
  return 1;
}

Assistant:

inline int InitP33x(P33X* pP33x)
{
	uint8 readbuf[10];
	uint8 writebuf[4];
	uint8 crc_h = 0;
	uint8 crc_l = 0;
	//int devclass = 0;
	//int group = 0;
	//int year = 0;
	//int week = 0;
	//int buf = 0;
	//int stat = 0;

	writebuf[0] = (uint8)0xfa; // device address = 250
	writebuf[1] = (uint8)0x30; // function 48
	CalcCRC16(writebuf, 4-2, &(writebuf[2]), &(writebuf[3])); // CRC-16

	if (WriteAllRS232Port(&pP33x->RS232Port, writebuf, 4) != EXIT_SUCCESS)
	{ 
		printf("Error writing data to a P33x. \n");
		return EXIT_FAILURE;
	}

	// Read the echo.
	if (ReadAllRS232Port(&pP33x->RS232Port, readbuf, 4) != EXIT_SUCCESS)
	{
		printf("Error reading data from a P33x. \n");
		return EXIT_FAILURE;
	}

	// Read the data.
	if (ReadAllRS232Port(&pP33x->RS232Port, readbuf, 10) != EXIT_SUCCESS)
	{ 
		printf("Error reading data from a P33x. \n");
		return EXIT_FAILURE;
	}

	// Device address = 250.
	if (readbuf[0] != (uint8)0xfa)
	{ 
		printf("Error reading data from a P33x : Bad device address. \n");
		return EXIT_FAILURE;	
	}

	// Function 48.
	if (readbuf[1] != (uint8)0x30)
	{ 
		printf("Error reading data from a P33x : The device function failed. \n");
		return EXIT_FAILURE;	
	}

	CalcCRC16(readbuf, 10-2, &crc_h, &crc_l);

	// CRC-16.
	if ((readbuf[8] != crc_h)||(readbuf[9] != crc_l))
	{ 
		printf("Error reading data from a P33x : Bad CRC-16. \n");
		return EXIT_FAILURE;	
	}

	//devclass = readbuf[2];
	//group = readbuf[3];
	//year = readbuf[4];
	//week = readbuf[5];
	//buf = readbuf[6];
	//stat = readbuf[7];

	//PRINT_DEBUG_MESSAGE_OSUTILS(("Device ID : %d.%d\n", devclass, group));
	//PRINT_DEBUG_MESSAGE_OSUTILS(("Firmware version : %d.%d\n", year, week));
	//PRINT_DEBUG_MESSAGE_OSUTILS(("Length of the internal receive buffer : %d\n", buf));
	//PRINT_DEBUG_MESSAGE_OSUTILS(("Status information : %d\n", stat));

	return EXIT_SUCCESS;
}